

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::setupAttribute
          (vertexArrayObjectDefinition *this,attributeDefinition *attribute,
          bufferCollection *buffers,GLuint program_id)

{
  GLuint GVar1;
  GLenum GVar2;
  GLuint __len;
  sockaddr *__addr;
  GLint GVar3;
  string attribute_name;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  GVar1 = program_id;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"vs_in_","");
  std::__cxx11::string::append((char *)local_50);
  __len = 0x1b72618;
  switch(attribute->attribute_id) {
  case Position:
    break;
  case TextureCoordinates:
    buffers = (bufferCollection *)&buffers->texture_coordinate;
    break;
  case TextureCoordinatesForGather:
    buffers = (bufferCollection *)&buffers->texture_coordinate_for_gather;
    break;
  case Lod:
    buffers = (bufferCollection *)&buffers->lod;
    goto LAB_00d70321;
  case GradX:
    buffers = (bufferCollection *)&buffers->grad_x;
    break;
  case GradY:
    buffers = (bufferCollection *)&buffers->grad_y;
    break;
  case RefZ:
    buffers = (bufferCollection *)&buffers->refZ;
LAB_00d70321:
    GVar3 = 1;
    goto LAB_00d70326;
  default:
    buffers = (bufferCollection *)0x0;
    GVar3 = 0;
    __len = GVar1;
    goto LAB_00d70326;
  }
  GVar3 = 4;
LAB_00d70326:
  GVar1 = (*this->m_gl->getAttribLocation)(program_id,(GLchar *)local_50[0]);
  if ((GVar1 != 0xffffffff) && (GVar2 = (*this->m_gl->getError)(), GVar2 == 0)) {
    bufferDefinition::bind(&buffers->postion,0x8892,__addr,__len);
    (*this->m_gl->enableVertexAttribArray)(GVar1);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"Failed to enable attribute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0x1428);
    (*this->m_gl->vertexAttribPointer)(GVar1,GVar3,0x1406,'\0',0,(void *)0x0);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"Failed to setup vertex attribute arrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0x142c);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::setupAttribute(const attributeDefinition& attribute,
																				  const bufferCollection&	buffers,
																				  glw::GLuint				 program_id)
{
	std::string				attribute_name = vertex_shader_input;
	const bufferDefinition* buffer		   = 0;
	glw::GLuint				n_components   = 0;
	glw::GLenum				type		   = GL_FLOAT;

	attribute_name.append(attribute.name);

	switch (attribute.attribute_id)
	{
	case Position:
		n_components = 4;
		buffer		 = &buffers.postion;
		break;
	case TextureCoordinates:
		n_components = 4;
		buffer		 = &buffers.texture_coordinate;
		break;
	case TextureCoordinatesForGather:
		n_components = 4;
		buffer		 = &buffers.texture_coordinate_for_gather;
		break;
	case Lod:
		n_components = 1;
		buffer		 = &buffers.lod;
		break;
	case GradX:
		n_components = 4;
		buffer		 = &buffers.grad_x;
		break;
	case GradY:
		n_components = 4;
		buffer		 = &buffers.grad_y;
		break;
	case RefZ:
		n_components = 1;
		buffer		 = &buffers.refZ;
		break;
	}

	/* Get attribute location */
	glw::GLint attribute_location = m_gl->getAttribLocation(program_id, attribute_name.c_str());

	if ((m_invalid_attribute_location == (glw::GLuint)attribute_location) || (GL_NO_ERROR != m_gl->getError()))
	{
		//throw tcu::InternalError("Failed to get location of attribute:", attribute_name.c_str(), __FILE__, __LINE__);
		return;
	}

	buffer->bind(GL_ARRAY_BUFFER);

	m_gl->enableVertexAttribArray(attribute_location);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to enable attribute");

	m_gl->vertexAttribPointer(attribute_location, n_components, type, GL_FALSE, 0 /* stride */, 0 /* offset */);

	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to setup vertex attribute arrays");
}